

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TableSortSpecsBuild(ImGuiTable *table)

{
  long in_RDI;
  ImGuiTableSortSpecsColumn *sort_spec;
  ImGuiTableColumn *column;
  int column_n;
  ImGuiTable *in_stack_00000030;
  int in_stack_ffffffffffffffdc;
  ImVector<ImGuiTableSortSpecsColumn> *in_stack_ffffffffffffffe0;
  ImGuiTableColumn *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  if ((*(byte *)(in_RDI + 0x1d5) & 1) == 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x2811,"TableSortSpecsBuild","ImGui ASSERT FAILED: %s","table->IsSortSpecsDirty");
  }
  TableSortSpecsSanitize(in_stack_00000030);
  ImVector<ImGuiTableSortSpecsColumn>::resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  *(undefined8 *)(in_RDI + 0x1b8) = 0;
  for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x6c); iVar1 = iVar1 + 1) {
    in_stack_ffffffffffffffe8 =
         ImSpan<ImGuiTableColumn>::operator[]
                   ((ImSpan<ImGuiTableColumn> *)CONCAT44(iVar1,in_stack_fffffffffffffff0),
                    (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
    if (in_stack_ffffffffffffffe8->SortOrder != -1) {
      in_stack_ffffffffffffffe0 =
           (ImVector<ImGuiTableSortSpecsColumn> *)
           ImVector<ImGuiTableSortSpecsColumn>::operator[]
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
      in_stack_ffffffffffffffe0->Size = in_stack_ffffffffffffffe8->UserID;
      *(byte *)&in_stack_ffffffffffffffe0->Capacity = (byte)iVar1;
      *(ImS8 *)((long)&in_stack_ffffffffffffffe0->Capacity + 1) =
           in_stack_ffffffffffffffe8->SortOrder;
      *(ImS8 *)((long)&in_stack_ffffffffffffffe0->Capacity + 2) =
           in_stack_ffffffffffffffe8->SortDirection;
      *(ulong *)(in_RDI + 0x1b8) = 1L << ((byte)iVar1 & 0x3f) | *(ulong *)(in_RDI + 0x1b8);
    }
  }
  *(undefined8 *)(in_RDI + 0x1a8) = *(undefined8 *)(in_RDI + 0x1a0);
  *(undefined4 *)(in_RDI + 0x1b0) = *(undefined4 *)(in_RDI + 0x198);
  *(undefined1 *)(in_RDI + 0x1d5) = 0;
  *(undefined1 *)(in_RDI + 0x1d6) = 1;
  return;
}

Assistant:

void ImGui::TableSortSpecsBuild(ImGuiTable* table)
{
    IM_ASSERT(table->IsSortSpecsDirty);
    TableSortSpecsSanitize(table);

    // Write output
    table->SortSpecsData.resize(table->SortSpecsCount);
    table->SortSpecs.ColumnsMask = 0x00;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder == -1)
            continue;
        ImGuiTableSortSpecsColumn* sort_spec = &table->SortSpecsData[column->SortOrder];
        sort_spec->ColumnUserID = column->UserID;
        sort_spec->ColumnIndex = (ImU8)column_n;
        sort_spec->SortOrder = (ImU8)column->SortOrder;
        sort_spec->SortDirection = column->SortDirection;
        table->SortSpecs.ColumnsMask |= (ImU64)1 << column_n;
    }
    table->SortSpecs.Specs = table->SortSpecsData.Data;
    table->SortSpecs.SpecsCount = table->SortSpecsData.Size;

    table->IsSortSpecsDirty = false;
    table->IsSortSpecsChangedForUser = true;
}